

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void releaseMemArray(Mem *p,int N)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Mem *pEnd;
  Mem *pMStack_10;
  int N_local;
  Mem *p_local;
  
  if ((p != (Mem *)0x0) && (N != 0)) {
    db_00 = p->db;
    pMStack_10 = p;
    if (db_00->pnBytesFreed == (int *)0x0) {
      do {
        if ((pMStack_10->flags & 0x9000) == 0) {
          if (pMStack_10->szMalloc != 0) {
            sqlite3DbNNFreeNN(db_00,pMStack_10->zMalloc);
            pMStack_10->szMalloc = 0;
            pMStack_10->flags = 0;
          }
        }
        else {
          sqlite3VdbeMemRelease(pMStack_10);
          pMStack_10->flags = 0;
        }
        pMStack_10 = pMStack_10 + 1;
      } while (pMStack_10 < p + N);
    }
    else {
      do {
        if (pMStack_10->szMalloc != 0) {
          sqlite3DbFree(db_00,pMStack_10->zMalloc);
        }
        pMStack_10 = pMStack_10 + 1;
      } while (pMStack_10 < p + N);
    }
  }
  return;
}

Assistant:

static void releaseMemArray(Mem *p, int N){
  if( p && N ){
    Mem *pEnd = &p[N];
    sqlite3 *db = p->db;
    if( db->pnBytesFreed ){
      do{
        if( p->szMalloc ) sqlite3DbFree(db, p->zMalloc);
      }while( (++p)<pEnd );
      return;
    }
    do{
      assert( (&p[1])==pEnd || p[0].db==p[1].db );
      assert( sqlite3VdbeCheckMemInvariants(p) );

      /* This block is really an inlined version of sqlite3VdbeMemRelease()
      ** that takes advantage of the fact that the memory cell value is
      ** being set to NULL after releasing any dynamic resources.
      **
      ** The justification for duplicating code is that according to
      ** callgrind, this causes a certain test case to hit the CPU 4.7
      ** percent less (x86 linux, gcc version 4.1.2, -O6) than if
      ** sqlite3MemRelease() were called from here. With -O2, this jumps
      ** to 6.6 percent. The test case is inserting 1000 rows into a table
      ** with no indexes using a single prepared INSERT statement, bind()
      ** and reset(). Inserts are grouped into a transaction.
      */
      testcase( p->flags & MEM_Agg );
      testcase( p->flags & MEM_Dyn );
      if( p->flags&(MEM_Agg|MEM_Dyn) ){
        testcase( (p->flags & MEM_Dyn)!=0 && p->xDel==sqlite3VdbeFrameMemDel );
        sqlite3VdbeMemRelease(p);
        p->flags = MEM_Undefined;
      }else if( p->szMalloc ){
        sqlite3DbNNFreeNN(db, p->zMalloc);
        p->szMalloc = 0;
        p->flags = MEM_Undefined;
      }
#ifdef SQLITE_DEBUG
      else{
        p->flags = MEM_Undefined;
      }
#endif
    }while( (++p)<pEnd );
  }
}